

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcLits.c
# Opt level: O1

int Mvc_CoverBestLiteral(Mvc_Cover_t *pCover,Mvc_Cube_t *pMask)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Mvc_Cube_t *pMVar4;
  int iVar5;
  
  if (pCover->nBits < 1) {
    return -1;
  }
  uVar3 = 0;
  iVar2 = -1;
  uVar1 = 0xffffffff;
  do {
    if ((pMask == (Mvc_Cube_t *)0x0) || ((pMask->pData[uVar3 >> 5] >> (uVar3 & 0x1f) & 1) != 0)) {
      pMVar4 = (pCover->lCubes).pHead;
      if (pMVar4 == (Mvc_Cube_t *)0x0) {
        iVar5 = 0;
      }
      else {
        iVar5 = 0;
        do {
          iVar5 = iVar5 + (uint)((pMVar4->pData[uVar3 >> 5] >> (uVar3 & 0x1f) & 1) != 0);
          pMVar4 = pMVar4->pNext;
        } while (pMVar4 != (Mvc_Cube_t *)0x0);
      }
      if (iVar2 < iVar5) {
        uVar1 = uVar3;
      }
      if (iVar2 <= iVar5) {
        iVar2 = iVar5;
      }
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != pCover->nBits);
  uVar3 = 0xffffffff;
  if (1 < iVar2) {
    uVar3 = uVar1;
  }
  return uVar3;
}

Assistant:

int Mvc_CoverBestLiteral( Mvc_Cover_t * pCover, Mvc_Cube_t * pMask )
{
    Mvc_Cube_t * pCube;
    int nWord, nBit;
    int i, iMax, nLitsMax, nLitsCur;
    int fUseFirst = 1;

    // go through each literal
    iMax = -1;
    nLitsMax = -1;
    for ( i = 0; i < pCover->nBits; i++ )
        if ( !pMask || Mvc_CubeBitValue(pMask,i) )
        {
            // get the word and bit of this literal
            nWord = Mvc_CubeWhichWord(i);
            nBit  = Mvc_CubeWhichBit(i);
            // go through all the cubes
            nLitsCur = 0;
            Mvc_CoverForEachCube( pCover, pCube )
                if ( pCube->pData[nWord] & (1<<nBit) )
                    nLitsCur++;

            // check if this is the best literal
            if ( fUseFirst )
            {
                if ( nLitsMax < nLitsCur )
                {
                    nLitsMax = nLitsCur;
                    iMax = i;
                }
            }
            else
            {
                if ( nLitsMax <= nLitsCur )
                {
                    nLitsMax = nLitsCur;
                    iMax = i;
                }
            }
        }

    if ( nLitsMax > 1 )
        return iMax;
    return -1;
}